

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void likeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem *p;
  sqlite3 *psVar1;
  int iVar2;
  u32 esc;
  u8 *zPattern;
  u8 *zString;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  uchar *zEsc;
  byte *local_38;
  
  p = &context->s;
  psVar1 = (context->s).db;
  zPattern = (u8 *)sqlite3ValueText(*argv,'\x01');
  zString = (u8 *)sqlite3ValueText(argv[1],'\x01');
  iVar2 = sqlite3ValueBytes(*argv,'\x01');
  if (psVar1->aLimit[8] < iVar2) {
    context->isError = 1;
    sqlite3VdbeMemSetStr
              (p,"LIKE or GLOB pattern too complex",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  esc = 0;
  if (argc == 3) {
    local_38 = (byte *)sqlite3ValueText(argv[2],'\x01');
    if (local_38 == (byte *)0x0) {
      return;
    }
    bVar4 = *local_38;
    if (local_38 != (byte *)0xffffffffffffffff && bVar4 != 0) {
      pbVar3 = local_38;
      iVar2 = 0;
      do {
        iVar5 = iVar2;
        if (bVar4 < 0xc0) {
          bVar4 = pbVar3[1];
        }
        else {
          bVar4 = pbVar3[1];
        }
        pbVar3 = pbVar3 + 1;
      } while ((bVar4 != 0) && (iVar2 = iVar5 + 1, pbVar3 != (byte *)0xffffffffffffffff));
      if (iVar5 == 0) {
        esc = sqlite3Utf8Read(&local_38);
        goto LAB_0017216a;
      }
    }
    context->isError = 1;
    sqlite3VdbeMemSetStr
              (p,"ESCAPE expression must be a single character",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
LAB_0017216a:
    if (zPattern != (u8 *)0x0 && zString != (u8 *)0x0) {
      iVar2 = patternCompare(zPattern,zString,(compareInfo *)context->pFunc->pUserData,esc);
      sqlite3VdbeMemRelease(p);
      (context->s).u = (anon_union_8_5_44880d43_for_u)(long)iVar2;
      (context->s).flags = 4;
      (context->s).type = '\x01';
    }
  }
  return;
}

Assistant:

static void likeFunc(
  sqlite3_context *context, 
  int argc, 
  sqlite3_value **argv
){
  const unsigned char *zA, *zB;
  u32 escape = 0;
  int nPat;
  sqlite3 *db = sqlite3_context_db_handle(context);

  zB = sqlite3_value_text(argv[0]);
  zA = sqlite3_value_text(argv[1]);

  /* Limit the length of the LIKE or GLOB pattern to avoid problems
  ** of deep recursion and N*N behavior in patternCompare().
  */
  nPat = sqlite3_value_bytes(argv[0]);
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] );
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH]+1 );
  if( nPat > db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] ){
    sqlite3_result_error(context, "LIKE or GLOB pattern too complex", -1);
    return;
  }
  assert( zB==sqlite3_value_text(argv[0]) );  /* Encoding did not change */

  if( argc==3 ){
    /* The escape character string must consist of a single UTF-8 character.
    ** Otherwise, return an error.
    */
    const unsigned char *zEsc = sqlite3_value_text(argv[2]);
    if( zEsc==0 ) return;
    if( sqlite3Utf8CharLen((char*)zEsc, -1)!=1 ){
      sqlite3_result_error(context, 
          "ESCAPE expression must be a single character", -1);
      return;
    }
    escape = sqlite3Utf8Read(&zEsc);
  }
  if( zA && zB ){
    struct compareInfo *pInfo = sqlite3_user_data(context);
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    
    sqlite3_result_int(context, patternCompare(zB, zA, pInfo, escape));
  }
}